

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Joint.h
# Opt level: O2

void __thiscall RigidBodyDynamics::Joint::Joint(Joint *this,SpatialVector *axis_0)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  bool bVar6;
  SpatialVector *pSVar7;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 uStack_38;
  undefined8 uStack_30;
  undefined8 uStack_28;
  undefined8 local_20;
  
  this->mDoFCount = 1;
  pSVar7 = (SpatialVector *)operator_new__(0x30);
  this->mJointAxes = pSVar7;
  dVar1 = (axis_0->super_Matrix<double,_6,_1,_0,_6,_1>).
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1];
  dVar2 = (axis_0->super_Matrix<double,_6,_1,_0,_6,_1>).
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2];
  dVar3 = (axis_0->super_Matrix<double,_6,_1,_0,_6,_1>).
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3];
  dVar4 = (axis_0->super_Matrix<double,_6,_1,_0,_6,_1>).
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4];
  dVar5 = (axis_0->super_Matrix<double,_6,_1,_0,_6,_1>).
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5];
  (pSVar7->super_Matrix<double,_6,_1,_0,_6,_1>).
  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0] =
       (axis_0->super_Matrix<double,_6,_1,_0,_6,_1>).
       super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0];
  (pSVar7->super_Matrix<double,_6,_1,_0,_6,_1>).
  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1] = dVar1;
  (pSVar7->super_Matrix<double,_6,_1,_0,_6,_1>).
  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2] = dVar2;
  (pSVar7->super_Matrix<double,_6,_1,_0,_6,_1>).
  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3] = dVar3;
  (pSVar7->super_Matrix<double,_6,_1,_0,_6,_1>).
  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4] = dVar4;
  (pSVar7->super_Matrix<double,_6,_1,_0,_6,_1>).
  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5] = dVar5;
  local_48 = 0x3ff0000000000000;
  uStack_40 = 0;
  uStack_38 = 0;
  uStack_30 = 0;
  uStack_28 = 0;
  local_20 = 0;
  bVar6 = Eigen::MatrixBase<Eigen::Matrix<double,6,1,0,6,1>>::operator==
                    ((MatrixBase<Eigen::Matrix<double,6,1,0,6,1>> *)axis_0,
                     (MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)&local_48);
  if (bVar6) {
    this->mJointType = JointTypeRevoluteX;
  }
  else {
    local_48 = 0;
    uStack_40 = 0x3ff0000000000000;
    uStack_38 = 0;
    uStack_30 = 0;
    uStack_28 = 0;
    local_20 = 0;
    bVar6 = Eigen::MatrixBase<Eigen::Matrix<double,6,1,0,6,1>>::operator==
                      ((MatrixBase<Eigen::Matrix<double,6,1,0,6,1>> *)axis_0,
                       (MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)&local_48);
    if (bVar6) {
      this->mJointType = JointTypeRevoluteY;
    }
    else {
      local_48 = 0;
      uStack_40 = 0;
      uStack_38 = 0x3ff0000000000000;
      uStack_30 = 0;
      uStack_28 = 0;
      local_20 = 0;
      bVar6 = Eigen::MatrixBase<Eigen::Matrix<double,6,1,0,6,1>>::operator==
                        ((MatrixBase<Eigen::Matrix<double,6,1,0,6,1>> *)axis_0,
                         (MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)&local_48);
      if (bVar6) {
        this->mJointType = JointTypeRevoluteZ;
      }
      else {
        this->mJointType = JointType1DoF;
      }
    }
  }
  validate_spatial_axis(this,this->mJointAxes);
  return;
}

Assistant:

Joint (
			const Math::SpatialVector &axis_0
			) {
		mDoFCount = 1;
		mJointAxes = new Math::SpatialVector[mDoFCount];
		mJointAxes[0] = Math::SpatialVector (axis_0);
		if (axis_0 == Math::SpatialVector(1., 0., 0., 0., 0., 0.)) {
			mJointType = JointTypeRevoluteX;
		} else if (axis_0 == Math::SpatialVector(0., 1., 0., 0., 0., 0.)) {
			mJointType = JointTypeRevoluteY;
		} else if (axis_0 == Math::SpatialVector(0., 0., 1., 0., 0., 0.)) {
			mJointType = JointTypeRevoluteZ;
		} else {
			mJointType = JointType1DoF;
		}
		validate_spatial_axis (mJointAxes[0]);
	}